

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::ElifTemplateToken::ElifTemplateToken
          (ElifTemplateToken *this,Location *loc,SpaceHandling pre,SpaceHandling post,
          shared_ptr<minja::Expression> *c)

{
  Type in_EDX;
  TemplateToken *in_RSI;
  shared_ptr<minja::Expression> *in_RDI;
  Location *in_R8;
  
  TemplateToken::TemplateToken
            (in_RSI,in_EDX,in_R8,(SpaceHandling)((ulong)in_RDI >> 0x20),(SpaceHandling)in_RDI);
  (in_RDI->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__ElifTemplateToken_00443ff8;
  std::shared_ptr<minja::Expression>::shared_ptr((shared_ptr<minja::Expression> *)in_R8,in_RDI);
  return;
}

Assistant:

ElifTemplateToken(const Location & loc, SpaceHandling pre, SpaceHandling post, std::shared_ptr<Expression> && c) : TemplateToken(Type::Elif, loc, pre, post), condition(std::move(c)) {}